

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execTrapcc<(moira::Core)2,(moira::Instr)163,(moira::Mode)12,2>(Moira *this,u16 opcode)

{
  ushort uVar1;
  u32 uVar2;
  
  this->cp = 0;
  uVar1 = opcode & 7;
  if (uVar1 == 3) {
    readI<(moira::Core)2,4>(this);
  }
  else if (uVar1 == 2) {
    uVar2 = (this->reg).pc + 2;
    (this->reg).pc = uVar2;
    uVar2 = read<(moira::Core)2,(moira::AddrSpace)2,2,0ull>(this,uVar2);
    (this->queue).irc = (u16)uVar2;
    this->readBuffer = (u16)uVar2;
  }
  if (((this->reg).sr.n == (this->reg).sr.v) && (((this->reg).sr.z & 1U) == 0)) {
    execException<(moira::Core)2>(this,TRAPV,0);
    (*this->_vptr_Moira[2])(this,(ulong)(this->cp + 0x14));
    return;
  }
  if ((ushort)(uVar1 - 2) < 3) {
    (*this->_vptr_Moira[2])
              (this,(ulong)(uint)(this->cp +
                                 *(int *)(&DAT_00472b2c + (ulong)(ushort)(uVar1 - 2) * 4)));
  }
  uVar2 = (this->reg).pc;
  (this->reg).pc0 = uVar2;
  (this->queue).ird = (this->queue).irc;
  uVar2 = read<(moira::Core)2,(moira::AddrSpace)2,2,4ull>(this,uVar2 + 2);
  (this->queue).irc = (u16)uVar2;
  this->readBuffer = (u16)uVar2;
  return;
}

Assistant:

void
Moira::execTrapcc(u16 opcode)
{
    AVAILABILITY(Core::C68020)

    switch (opcode & 0b111) {

        case 0b010: (void)readI<C, Word>(); break;
        case 0b011: (void)readI<C, Long>(); break;
    }

    if (cond<I>()) {

        execException<C>(M68kException::TRAPV);
        CYCLES_68020(20);
        return;
    }

    switch (opcode & 0b111) {

        case 0b100: CYCLES_68020(4); break;
        case 0b010: CYCLES_68020(6); break;
        case 0b011: CYCLES_68020(8); break;
    }

    prefetch<C, POLL>();

    FINALIZE
}